

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfTexture(Texture *texture,json *o)

{
  char cVar1;
  long lVar2;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  json *local_18;
  json *o_local;
  Texture *texture_local;
  
  local_18 = o;
  o_local = (json *)texture;
  if (-1 < texture->sampler) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"sampler",&local_39);
    SerializeNumberProperty<int>(&local_38,*(int *)(o_local + 2),local_18);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  if (-1 < *(int *)&o_local[2].field_0x4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"source",&local_71);
    SerializeNumberProperty<int>(&local_70,*(int *)&o_local[2].field_0x4,local_18);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"name",&local_99);
    SerializeStringProperty(&local_98,(string *)o_local,local_18);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  cVar1 = Value::Type((Value *)&o_local[2].m_value);
  if (cVar1 != '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"extras",&local_c1);
    SerializeValue(&local_c0,(Value *)&o_local[2].m_value,local_18);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  SerializeExtensionMap((ExtensionMap *)(o_local + 0xc),local_18);
  return;
}

Assistant:

static void SerializeGltfTexture(Texture &texture, json &o) {
  if (texture.sampler > -1) {
    SerializeNumberProperty("sampler", texture.sampler, o);
  }
  if (texture.source > -1) {
    SerializeNumberProperty("source", texture.source, o);
  }
  if (texture.name.size()) {
    SerializeStringProperty("name", texture.name, o);
  }
  if (texture.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", texture.extras, o);
  }
  SerializeExtensionMap(texture.extensions, o);
}